

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

void __thiscall astar::Map::Print(Map *this)

{
  ostream *poVar1;
  reference pvVar2;
  reference pvVar3;
  int local_1c;
  int local_18;
  int j_1;
  int j;
  int i;
  Map *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"{");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (j_1 = 0; j_1 < this->n + -1; j_1 = j_1 + 1) {
    std::operator<<((ostream *)&std::cout,"{");
    for (local_18 = 0; local_18 < this->m + -1; local_18 = local_18 + 1) {
      pvVar2 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->map,(long)j_1);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_18);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
      std::operator<<(poVar1,", ");
    }
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->map,(long)j_1);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)(this->m + -1));
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
    poVar1 = std::operator<<(poVar1,"},");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"{");
  for (local_1c = 0; local_1c < this->m + -1; local_1c = local_1c + 1) {
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->map,(long)(this->n + -1));
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)local_1c);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
    std::operator<<(poVar1,", ");
  }
  if ((0 < this->n) && (0 < this->m)) {
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->map,(long)(this->n + -1));
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(long)(this->m + -1));
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pvVar3);
    poVar1 = std::operator<<(poVar1,"}\n}");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Map::Print()
{
    std::cout << "{" << std::endl;
    for (int i = 0; i < (n - 1); i++) {
        std::cout << "{";
        for (int j = 0; j < (m - 1); j++) {
            std::cout << map[i][j] << ", ";
        }
        std::cout << map[i][m - 1] << "}," << std::endl;
    }
    std::cout << "{";
    for (int j = 0; j < (m - 1); j++) {
        std::cout << map[n - 1][j] << ", ";
    }
    if (n > 0 && m > 0) {
        std::cout << map[n - 1][m - 1] << "}\n}" << std::endl;
    }
}